

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assertions.hpp
# Opt level: O1

void rc::detail::
     doAssert<rc::detail::expr::GT<rc::detail::expr::Plus<rc::detail::expr::Plus<rc::detail::expr::Plus<rc::detail::expr::Value<unsigned_long>,unsigned_long>,unsigned_long>,int>,unsigned_int>>
               (GT<rc::detail::expr::Plus<rc::detail::expr::Plus<rc::detail::expr::Plus<rc::detail::expr::Value<unsigned_long>,_unsigned_long>,_unsigned_long>,_int>,_unsigned_int>
                *expression,bool expectedResult,Type type,string *file,int line,string *assertion)

{
  Plus<rc::detail::expr::Plus<rc::detail::expr::Value<unsigned_long>,_unsigned_long>,_unsigned_long>
  *pPVar1;
  Plus<rc::detail::expr::Value<unsigned_long>,_unsigned_long> *pPVar2;
  CaseResult *this;
  ostringstream ss;
  string sStack_1e8;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  pPVar1 = expression->m_lexpr->m_lexpr;
  pPVar2 = pPVar1->m_lexpr;
  if ((ulong)*expression->m_rhs <
      (long)*expression->m_lexpr->m_rhs +
      *pPVar2->m_rhs + *pPVar2->m_lexpr->m_value + *pPVar1->m_rhs == expectedResult) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  expr::
  GT<rc::detail::expr::Plus<rc::detail::expr::Plus<rc::detail::expr::Plus<rc::detail::expr::Value<unsigned_long>,_unsigned_long>,_unsigned_long>,_int>,_unsigned_int>
  ::show(expression,(ostream *)local_1a8);
  this = (CaseResult *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  makeExpressionMessage(&local_1c8,file,line,assertion,&sStack_1e8);
  CaseResult::CaseResult(this,type,&local_1c8);
  __cxa_throw(this,&CaseResult::typeinfo,CaseResult::~CaseResult);
}

Assistant:

void doAssert(const Expression &expression,
              bool expectedResult,
              CaseResult::Type type,
              const std::string &file,
              int line,
              const std::string &assertion) {
  if (static_cast<bool>(expression.value()) != expectedResult) {
    std::ostringstream ss;
    expression.show(ss);
    throw CaseResult(type,
                     makeExpressionMessage(file, line, assertion, ss.str()));
  }
}